

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subset_iterator.hpp
# Opt level: O3

bool __thiscall
burst::
subset_iterator<boost::range_detail::integer_iterator<int>,_std::less<void>,_std::vector<boost::range_detail::integer_iterator<int>,_std::allocator<boost::range_detail::integer_iterator<int>_>_>_>
::equal(subset_iterator<boost::range_detail::integer_iterator<int>,_std::less<void>,_std::vector<boost::range_detail::integer_iterator<int>,_std::allocator<boost::range_detail::integer_iterator<int>_>_>_>
        *this,subset_iterator<boost::range_detail::integer_iterator<int>,_std::less<void>,_std::vector<boost::range_detail::integer_iterator<int>,_std::allocator<boost::range_detail::integer_iterator<int>_>_>_>
              *that)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  bool bVar4;
  
  if ((this->m_begin).m_value != (that->m_begin).m_value) {
    __assert_fail("this->m_begin == that.m_begin",
                  "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/iterator/subset_iterator.hpp"
                  ,0x81,
                  "bool burst::subset_iterator<boost::range_detail::integer_iterator<int>>::equal(const subset_iterator<ForwardIterator, Compare, SubsetContainer> &) const [ForwardIterator = boost::range_detail::integer_iterator<int>, Compare = std::less<void>, SubsetContainer = std::vector<boost::range_detail::integer_iterator<int>>]"
                 );
  }
  if ((this->m_end).m_value == (that->m_end).m_value) {
    lVar1 = this->m_subset_size;
    if (lVar1 == that->m_subset_size) {
      if (lVar1 == 0) {
        bVar3 = true;
      }
      else {
        lVar2 = 0;
        do {
          bVar3 = *(int *)((long)&((this->m_subset).
                                   super__Vector_base<boost::range_detail::integer_iterator<int>,_std::allocator<boost::range_detail::integer_iterator<int>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->m_value + lVar2) ==
                  *(int *)((long)&((that->m_subset).
                                   super__Vector_base<boost::range_detail::integer_iterator<int>,_std::allocator<boost::range_detail::integer_iterator<int>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->m_value + lVar2);
          if (!bVar3) {
            return bVar3;
          }
          bVar4 = lVar1 * 4 + -4 != lVar2;
          lVar2 = lVar2 + 4;
        } while (bVar4);
      }
    }
    else {
      bVar3 = false;
    }
    return bVar3;
  }
  __assert_fail("this->m_end == that.m_end",
                "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/iterator/subset_iterator.hpp"
                ,0x82,
                "bool burst::subset_iterator<boost::range_detail::integer_iterator<int>>::equal(const subset_iterator<ForwardIterator, Compare, SubsetContainer> &) const [ForwardIterator = boost::range_detail::integer_iterator<int>, Compare = std::less<void>, SubsetContainer = std::vector<boost::range_detail::integer_iterator<int>>]"
               );
}

Assistant:

bool equal (const subset_iterator & that) const
        {
            BOOST_ASSERT(this->m_begin == that.m_begin);
            BOOST_ASSERT(this->m_end == that.m_end);
            return
                std::equal
                (
                    this->subset_begin(), this->subset_end(),
                    that.subset_begin(), that.subset_end()
                );
        }